

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O1

size_t __thiscall proto3::MapOutWireFormat::ByteSizeLong(MapOutWireFormat *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  size_t sVar5;
  size_t sVar6;
  RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *this_00;
  RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *this_01;
  RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *this_02;
  RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *this_03;
  long lVar7;
  RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *pRVar8;
  RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *pRVar9;
  RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *pRVar10;
  RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *pRVar11;
  
  lVar7 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.map1_;
  pRVar8 = this_00;
  if ((undefined1  [112])((undefined1  [112])this->field_0 & (undefined1  [112])0x1) !=
      (undefined1  [112])0x0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar8 = (RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *)pRVar4->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *)pRVar4->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar8 != (RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar8 = (RepeatedPtrField<proto3::MapOutWireFormat_Map1Entry> *)
               &(pRVar8->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = MapOutWireFormat_Map1Entry::ByteSizeLong
                      ((MapOutWireFormat_Map1Entry *)
                       (pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar7 = lVar7 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_01 = &(this->field_0)._impl_.map2_;
  pRVar9 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_01->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *)pRVar4->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *)pRVar4->elements;
  }
  lVar7 = lVar7 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar9 != (RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *)
                   (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar9 = (RepeatedPtrField<proto3::MapOutWireFormat_Map2Entry> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = MapOutWireFormat_Map2Entry::ByteSizeLong
                      ((MapOutWireFormat_Map2Entry *)
                       (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar7 = lVar7 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  this_02 = &(this->field_0)._impl_.map3_;
  pRVar10 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_02->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *)pRVar4->elements;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *)pRVar4->elements;
  }
  lVar7 = lVar7 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar10 !=
         (RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<proto3::MapOutWireFormat_Map3Entry> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = MapOutWireFormat_Map3Entry::ByteSizeLong
                      ((MapOutWireFormat_Map3Entry *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar7 = lVar7 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  this_03 = &(this->field_0)._impl_.map4_;
  pRVar11 = this_03;
  if ((*(byte *)((long)&this->field_0 + 0x50) & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_03->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *)pRVar4->elements;
  }
  if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_03->super_RepeatedPtrFieldBase);
    this_03 = (RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *)pRVar4->elements;
  }
  sVar5 = lVar7 + iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  for (; pRVar11 !=
         (RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *)
         (&(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar11 = (RepeatedPtrField<proto3::MapOutWireFormat_Map4Entry> *)
                &(pRVar11->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = MapOutWireFormat_Map4Entry::ByteSizeLong
                      ((MapOutWireFormat_Map4Entry *)
                       (pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  if (((undefined1  [112])((undefined1  [112])this->field_0 & (undefined1  [112])0x1) !=
       (undefined1  [112])0x0) &&
     (lVar7 = *(long *)(((ulong)(this->field_0)._impl_.bar_.tagged_ptr_.ptr_ & 0xfffffffffffffffc) +
                       8), lVar7 != 0)) {
    uVar3 = (uint)lVar7 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar5 = sVar5 + lVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t MapOutWireFormat::ByteSizeLong() const {
  const MapOutWireFormat& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.MapOutWireFormat)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3.MapOutWireFormat.Map1Entry map1 = 1;
    {
      total_size += 1UL * this_._internal_map1_size();
      for (const auto& msg : this_._internal_map1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map2Entry map2 = 2;
    {
      total_size += 1UL * this_._internal_map2_size();
      for (const auto& msg : this_._internal_map2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map3Entry map3 = 3;
    {
      total_size += 1UL * this_._internal_map3_size();
      for (const auto& msg : this_._internal_map3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto3.MapOutWireFormat.Map4Entry map4 = 5;
    {
      total_size += 1UL * this_._internal_map4_size();
      for (const auto& msg : this_._internal_map4()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
   {
    // string bar = 4;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_bar().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_bar());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}